

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

Property * Shell::Property::scan(UnitList *units)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Property *this;
  ulong uVar4;
  
  lVar3 = DAT_00a14190;
  lVar1 = *(long *)(DAT_00a14190 + 0x60);
  lVar2 = *(long *)(DAT_00a14190 + 0x68);
  for (uVar4 = 0; ((ulong)(lVar2 - lVar1) >> 3 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)(*(long *)(lVar1 + uVar4 * 8) + 0x38) = 0;
  }
  lVar1 = *(long *)(lVar3 + 0x80);
  lVar2 = *(long *)(lVar3 + 0x88);
  for (uVar4 = 0; ((ulong)(lVar2 - lVar1) >> 3 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
    *(undefined8 *)(*(long *)(lVar1 + uVar4 * 8) + 0x38) = 0;
  }
  this = (Property *)::operator_new(0x118);
  Property(this);
  add(this,units);
  return this;
}

Assistant:

Property* Property::scan(UnitList* units)
{
  // a bit of a hack, these counts belong in Property
  for(unsigned f=0;f<env.signature->functions();f++){ 
    env.signature->getFunction(f)->resetUsageCnt(); 
    env.signature->getFunction(f)->resetUnitUsageCnt(); 
   }
  for(unsigned p=0;p<env.signature->predicates();p++){ 
    env.signature->getPredicate(p)->resetUsageCnt(); 
    env.signature->getPredicate(p)->resetUnitUsageCnt(); 
   }

  Property* prop = new Property;
  prop->add(units);
  return prop;
}